

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fastpfor.cpp
# Opt level: O0

void __thiscall
FastPForLib::FastPForTest::_genDataWithFixBits
          (FastPForTest *this,vector<int,_std::allocator<int>_> *v,uint32_t bits,uint32_t values)

{
  uint in_ECX;
  vector<int,_std::allocator<int>_> *in_RSI;
  size_t i;
  uniform_int_distribution<unsigned_int> dist;
  mt19937_64 e2;
  uint in_stack_fffffffffffff5f8;
  uint in_stack_fffffffffffff5fc;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_stack_fffffffffffff600;
  vector<int,_std::allocator<int>_> *this_00;
  ulong local_9f0;
  
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x12aa82);
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::mersenne_twister_engine
            (in_stack_fffffffffffff600,CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8)
            );
  std::uniform_int_distribution<unsigned_int>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_int> *)in_stack_fffffffffffff600,
             in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8);
  for (local_9f0 = 0; local_9f0 < in_ECX; local_9f0 = local_9f0 + 1) {
    this_00 = in_RSI;
    std::uniform_int_distribution<unsigned_int>::operator()
              ((uniform_int_distribution<unsigned_int> *)in_RSI,
               (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
    std::vector<int,_std::allocator<int>_>::push_back
              (this_00,(value_type_conflict2 *)
                       CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
  }
  return;
}

Assistant:

void _genDataWithFixBits(
                                 std::vector<int32_t>& v,
                                 uint32_t bits,
                                 uint32_t values) {
          v.clear();
          std::mt19937_64 e2(123456);
          std::uniform_int_distribution<uint32_t> dist(
                                  0,
                                  bits == 32 ? ~0U : (1U << bits) - 1);
          for (size_t i = 0; i < values; ++i) {
            v.push_back(static_cast<int32_t>(dist(e2) | 1U << (bits - 1)));
          }
        }